

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelDiscreteInterface.h
# Opt level: O0

void __thiscall RewardModelDiscreteInterface::Print(RewardModelDiscreteInterface *this)

{
  long *in_RDI;
  string local_28 [40];
  
  (**(code **)(*in_RDI + 0x28))();
  std::operator<<((ostream *)&std::cout,local_28);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}